

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

N_Vector N_VClone_Serial(N_Vector w)

{
  N_Vector p_Var1;
  void *pvVar2;
  undefined8 *in_RDI;
  sunindextype length;
  sunrealtype *data;
  N_Vector v;
  SUNContext_conflict sunctx_local_scope_;
  
  p_Var1 = N_VCloneEmpty_Serial((N_Vector)in_RDI[2]);
  if (0 < *(long *)*in_RDI) {
    pvVar2 = malloc(*(long *)*in_RDI << 3);
    *(undefined4 *)((long)p_Var1->content + 8) = 1;
    *(void **)((long)p_Var1->content + 0x10) = pvVar2;
  }
  return p_Var1;
}

Assistant:

N_Vector N_VClone_Serial(N_Vector w)
{
  SUNFunctionBegin(w->sunctx);
  N_Vector v;
  sunrealtype* data;
  sunindextype length;

  v = NULL;
  v = N_VCloneEmpty_Serial(w);
  SUNCheckLastErrNull();

  length = NV_LENGTH_S(w);

  /* Create data */
  data = NULL;
  if (length > 0)
  {
    data = (sunrealtype*)malloc(length * sizeof(sunrealtype));
    SUNAssertNull(data, SUN_ERR_MALLOC_FAIL);

    /* Attach data */
    NV_OWN_DATA_S(v) = SUNTRUE;
    NV_DATA_S(v)     = data;
  }

  return (v);
}